

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1driver.c
# Opt level: O2

FT_UInt t1_get_name_index(T1_Face face,FT_String *glyph_name)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = (face->type1).num_glyphs;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  uVar3 = 0;
  while( true ) {
    if (uVar1 == uVar3) {
      return 0;
    }
    iVar2 = strcmp(glyph_name,(face->type1).glyph_names[uVar3]);
    if (iVar2 == 0) break;
    uVar3 = uVar3 + 1;
  }
  return (FT_UInt)uVar3;
}

Assistant:

static FT_UInt
  t1_get_name_index( T1_Face     face,
                     FT_String*  glyph_name )
  {
    FT_Int  i;


    for ( i = 0; i < face->type1.num_glyphs; i++ )
    {
      FT_String*  gname = face->type1.glyph_names[i];


      if ( !ft_strcmp( glyph_name, gname ) )
        return (FT_UInt)i;
    }

    return 0;
  }